

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

int __thiscall NavierStokesBase::steadyState(NavierStokesBase *this)

{
  bool bVar1;
  type_conflict1 *__a;
  double *pdVar2;
  Print *this_00;
  Print *os_;
  bool steady;
  Array4<double> *unew;
  Array4<double> *uold;
  Box *bx;
  MFIter mfi;
  ReduceData<double> reduce_data;
  ReduceOps<amrex::ReduceOpMax> reduce_op;
  Real max_change;
  MultiFab *u_new;
  MultiFab *u_old;
  undefined4 in_stack_fffffffffffff848;
  int in_stack_fffffffffffff84c;
  AmrLevel *in_stack_fffffffffffff850;
  anon_class_128_2_05ea3a5e *in_stack_fffffffffffff870;
  FabArrayBase *in_stack_fffffffffffff878;
  Print *in_stack_fffffffffffff880;
  ReduceOps<amrex::ReduceOpMax> *in_stack_fffffffffffff888;
  ReduceOps<amrex::ReduceOpMax> *in_stack_fffffffffffff8a8;
  Array4<double> *this_01;
  ReduceData<double> *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8c0;
  undefined4 uVar3;
  Array4<double> local_380;
  Array4<double> *local_340;
  Array4<double> local_338;
  Array4<double> *local_2f8;
  undefined1 local_2ec [28];
  undefined1 *local_2d0;
  MFIter local_2b8;
  double local_218;
  MultiFab *local_210;
  MultiFab *local_208;
  uint local_1f4;
  FArrayBox *local_1f0;
  FArrayBox *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  amrex::AmrLevel::get_state_data(in_stack_fffffffffffff850,in_stack_fffffffffffff84c);
  bVar1 = amrex::StateData::hasOldData((StateData *)0x52579e);
  if (bVar1) {
    uVar3 = 0;
    local_208 = amrex::AmrLevel::get_old_data(in_stack_fffffffffffff850,in_stack_fffffffffffff84c);
    local_210 = amrex::AmrLevel::get_new_data(in_stack_fffffffffffff850,in_stack_fffffffffffff84c);
    local_218 = 0.0;
    amrex::ReduceData<double>::ReduceData<amrex::ReduceOpMax>
              (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0));
    while (bVar1 = amrex::MFIter::isValid(&local_2b8), bVar1) {
      amrex::MFIter::tilebox(&local_2b8);
      local_2d0 = local_2ec;
      local_1e8 = amrex::FabArray<amrex::FArrayBox>::operator[]
                            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff850,
                             (MFIter *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848)
                            );
      local_198 = (local_1e8->super_BaseFab<double>).dptr;
      local_1a0 = &(local_1e8->super_BaseFab<double>).domain;
      local_1a4 = (local_1e8->super_BaseFab<double>).nvar;
      local_14c = 0;
      local_178 = (local_1a0->smallend).vect[0];
      local_15c = 1;
      iStack_174 = (local_1e8->super_BaseFab<double>).domain.smallend.vect[1];
      local_1c0.x = (local_1a0->smallend).vect[0];
      local_1c0.y = (local_1a0->smallend).vect[1];
      local_16c = 2;
      local_1c0.z = (local_1e8->super_BaseFab<double>).domain.smallend.vect[2];
      local_f8 = &(local_1e8->super_BaseFab<double>).domain.bigend;
      local_fc = 0;
      local_128 = local_f8->vect[0] + 1;
      local_108 = &(local_1e8->super_BaseFab<double>).domain.bigend;
      local_10c = 1;
      iStack_124 = (local_1e8->super_BaseFab<double>).domain.bigend.vect[1] + 1;
      local_118 = &(local_1e8->super_BaseFab<double>).domain.bigend;
      local_11c = 2;
      local_1e0.z = (local_1e8->super_BaseFab<double>).domain.bigend.vect[2] + 1;
      local_1e0.y = iStack_124;
      local_1e0.x = local_128;
      this_01 = &local_338;
      local_1d0._0_8_ = local_1e0._0_8_;
      local_1d0.z = local_1e0.z;
      local_1b0._0_8_ = local_1c0._0_8_;
      local_1b0.z = local_1c0.z;
      local_190._0_8_ = local_1c0._0_8_;
      local_190.z = local_1c0.z;
      local_180 = local_1a0;
      local_170 = local_1c0.z;
      local_168 = local_1a0;
      local_158 = local_1a0;
      local_148 = local_1a0;
      local_140._0_8_ = local_1e0._0_8_;
      local_140.z = local_1e0.z;
      local_130 = local_1a0;
      local_120 = local_1e0.z;
      amrex::Array4<double>::Array4(this_01,local_198,&local_1b0,&local_1d0,local_1a4);
      local_2f8 = this_01;
      local_1f0 = amrex::FabArray<amrex::FArrayBox>::operator[]
                            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff850,
                             (MFIter *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848)
                            );
      local_a8 = (local_1f0->super_BaseFab<double>).dptr;
      local_b0 = &(local_1f0->super_BaseFab<double>).domain;
      local_b4 = (local_1f0->super_BaseFab<double>).nvar;
      local_5c = 0;
      local_88 = (local_b0->smallend).vect[0];
      local_6c = 1;
      iStack_84 = (local_1f0->super_BaseFab<double>).domain.smallend.vect[1];
      local_d0.x = (local_b0->smallend).vect[0];
      local_d0.y = (local_b0->smallend).vect[1];
      local_7c = 2;
      local_d0.z = (local_1f0->super_BaseFab<double>).domain.smallend.vect[2];
      local_8 = &(local_1f0->super_BaseFab<double>).domain.bigend;
      local_c = 0;
      local_38 = local_8->vect[0] + 1;
      local_18 = &(local_1f0->super_BaseFab<double>).domain.bigend;
      local_1c = 1;
      iStack_34 = (local_1f0->super_BaseFab<double>).domain.bigend.vect[1] + 1;
      local_28 = &(local_1f0->super_BaseFab<double>).domain.bigend;
      local_2c = 2;
      local_f0.z = (local_1f0->super_BaseFab<double>).domain.bigend.vect[2] + 1;
      local_f0.y = iStack_34;
      local_f0.x = local_38;
      local_e0._0_8_ = local_f0._0_8_;
      local_e0.z = local_f0.z;
      local_c0._0_8_ = local_d0._0_8_;
      local_c0.z = local_d0.z;
      local_a0._0_8_ = local_d0._0_8_;
      local_a0.z = local_d0.z;
      local_90 = local_b0;
      local_80 = local_d0.z;
      local_78 = local_b0;
      local_68 = local_b0;
      local_58 = local_b0;
      local_50._0_8_ = local_f0._0_8_;
      local_50.z = local_f0.z;
      local_40 = local_b0;
      local_30 = local_f0.z;
      amrex::Array4<double>::Array4(&local_380,local_a8,&local_c0,&local_e0,local_b4);
      local_340 = &local_380;
      amrex::ReduceOps<amrex::ReduceOpMax>::
      eval<amrex::ReduceData<double>,NavierStokesBase::steadyState()::__0>
                (in_stack_fffffffffffff888,(Box *)in_stack_fffffffffffff880,
                 (ReduceData<double> *)in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      amrex::ReduceData<double>::value
                ((ReduceData<double> *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848)
                );
      __a = amrex::get<0ul,double>((GpuTuple<double> *)0x525eba);
      pdVar2 = std::max<double>(__a,&local_218);
      local_218 = *pdVar2;
      amrex::MFIter::operator++(&local_2b8);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff850);
    amrex::ParallelDescriptor::ReduceRealMax<double>(&local_218);
    bVar1 = local_218 < steady_tol;
    if (verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffff880,(ostream *)in_stack_fffffffffffff878);
      this_00 = amrex::Print::operator<<
                          ((Print *)in_stack_fffffffffffff850,
                           (char (*) [17])
                           CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      os_ = amrex::Print::operator<<
                      ((Print *)in_stack_fffffffffffff850,
                       (char (*) [7])CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff850,
                 (int *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff850,
                 (char (*) [15])CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff850,
                 (double *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff850,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      amrex::Print::~Print((Print *)CONCAT44(uVar3,in_stack_fffffffffffff8c0));
      if (bVar1) {
        amrex::OutStream();
        amrex::Print::Print(this_00,(ostream *)os_);
        in_stack_fffffffffffff850 =
             (AmrLevel *)
             amrex::Print::operator<<
                       ((Print *)in_stack_fffffffffffff850,
                        (char (*) [50])CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848)
                       );
        amrex::Print::operator<<
                  ((Print *)in_stack_fffffffffffff850,
                   (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                    *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
        amrex::Print::~Print((Print *)CONCAT44(uVar3,in_stack_fffffffffffff8c0));
      }
    }
    local_1f4 = (uint)bVar1;
    amrex::ReduceData<double>::~ReduceData((ReduceData<double> *)in_stack_fffffffffffff850);
  }
  else {
    local_1f4 = 0;
  }
  return local_1f4;
}

Assistant:

int
NavierStokesBase::steadyState()
{
    if (!get_state_data(State_Type).hasOldData()) {
        return false; // If nothing to compare to, must not yet be steady :)
    }

    MultiFab&   u_old = get_old_data(State_Type);
    MultiFab&   u_new = get_new_data(State_Type);

	//
	// Estimate the maximum change in velocity magnitude since previous
	// iteration
	//
    Real max_change = 0.0;

    ReduceOps<ReduceOpMax> reduce_op;
    ReduceData<Real> reduce_data(reduce_op);
    using ReduceTuple = typename decltype(reduce_data)::Type;

    // Do not OpenMP-fy this loop for now
    // Unclear how to keep OpenMP and GPU implementation
    // from messing with each other
    for (MFIter mfi(u_old,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const auto& bx   = mfi.tilebox();
        const auto& uold = u_old[mfi].array();
        const auto& unew = u_new[mfi].array();

        reduce_op.eval(bx, reduce_data, [uold, unew]
        AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            Real uold_mag = 0.0;
            Real unew_mag = 0.0;
            for (int d = 0; d < AMREX_SPACEDIM; ++d)
            {
                uold_mag += uold(i,j,k,d)*uold(i,j,k,d);
                unew_mag += unew(i,j,k,d)*unew(i,j,k,d);
            }

            uold_mag = std::sqrt(uold_mag);
            unew_mag = std::sqrt(unew_mag);

            return std::abs(unew_mag-uold_mag);
        });

        max_change = std::max(amrex::get<0>(reduce_data.value()),
                              max_change);
    }

    ParallelDescriptor::ReduceRealMax(max_change);

	//
	// System is classified as steady if the maximum change is smaller than
	// prescribed tolerance
	//
    bool steady = max_change < steady_tol;

    if (verbose)
    {
        amrex::Print() << "steadyState :: \n" << "LEV = " << level
                       << " MAX_CHANGE = " << max_change << std::endl;

        if (steady)
        {
            amrex::Print()
                << "System reached steady-state, stopping simulation."
                << std::endl;
        }
    }

    return steady;
}